

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall blc::network::Socket::~Socket(Socket *this)

{
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011abb0;
  if (this->_opened == true) {
    ::close(this->_socket);
  }
  std::__cxx11::string::~string((string *)&this->_address);
  return;
}

Assistant:

blc::network::Socket::~Socket() {
	if (this->_opened)
		::close(this->_socket);
}